

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

void __thiscall
unodb::test::
tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
insert_internal(tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *this,key_type k,value_view v,bool bypass_verifier)

{
  unsigned_long uVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  undefined7 in_register_00000081;
  pointer pcVar3;
  char *in_R9;
  pointer *__ptr;
  long in_FS_OFFSET;
  bool bVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_bool>
  pVar5;
  inode_type_counter_array growing_inodes_before;
  inode_type_counter_array shrinking_inodes_before;
  node_type_counter_array node_counts_before;
  undefined1 local_118 [8];
  value_view v_local;
  uint64_t key_prefix_splits_before;
  size_t local_b8;
  size_t mem_use_before;
  AssertHelper local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  value_type leaf_count_after;
  undefined1 auStack_88 [7];
  bool empty_before;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  size_t mem_use_after;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40 [2];
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  local_118 = (undefined1  [8])v._M_ptr;
  leaf_count_after._7_1_ = (this->test_db).root.tagged_ptr == 0;
  mem_use_before._4_4_ = (undefined4)CONCAT71(in_register_00000081,bypass_verifier);
  if (this->parallel_test == false) {
    local_b8 = (this->test_db).current_memory_use;
  }
  else {
    local_b8 = 0;
  }
  uVar1 = (this->test_db).node_counts._M_elems[0];
  v_local._M_extent._M_extent_value = (this->test_db).key_prefix_splits;
  tree_verifier<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  do_insert<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((tree_verifier<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)this,k,v);
  _Var2._M_head_impl = local_48._M_head_impl;
  bVar4 = (this->test_db).root.tagged_ptr == 0;
  local_48._M_head_impl._0_1_ = !bVar4;
  local_40[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar4) {
    testing::Message::Message((Message *)&local_58);
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_40;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_88,(internal *)&local_48,(AssertionResult *)"test_db.empty()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x18b,_auStack_88);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_auStack_88 != local_78) {
      operator_delete(_auStack_88,local_78[0]._M_allocated_capacity + 1);
    }
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    local_80 = local_40[0];
    if (local_40[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      return;
    }
    goto LAB_0012345a;
  }
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->test_db).current_memory_use;
  if (this->parallel_test == true) {
    local_48._M_head_impl = _Var2._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)auStack_88,"(mem_use_after)","(0)",(unsigned_long *)&local_58,
               (int *)&local_48);
    if (auStack_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_48);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,400,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_48);
      goto LAB_001233bf;
    }
LAB_00123142:
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_98._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this->test_db).node_counts._M_elems[0];
    if (this->parallel_test == true) {
      local_48._M_head_impl = local_48._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperGT<unsigned_long,int>
                ((internal *)auStack_88,"(leaf_count_after)","(0)",(unsigned_long *)&local_98,
                 (int *)&local_48);
      if (auStack_88[0] != (internal)0x0) {
LAB_0012320c:
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        if (mem_use_before._4_1_ != '\0') {
          return;
        }
        allocation_failure_injector::fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i
             = (__atomic_base<unsigned_long>)0;
        allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)0;
        *(undefined1 *)(in_FS_OFFSET + -0x20) = 1;
        _auStack_88 = (pointer)k;
        pVar5 = std::
                map<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                ::try_emplace<std::span<std::byte_const,18446744073709551615ul>&>
                          ((map<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                            *)&this->values,(key_type *)auStack_88,
                           (span<const_std::byte,_18446744073709551615UL> *)local_118);
        local_48._M_head_impl._0_1_ = pVar5.second;
        local_40[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)auStack_88,(internal *)&local_48,
                     (AssertionResult *)"insert_succeeded","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x1a4,_auStack_88);
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_auStack_88 != local_78) {
            operator_delete(_auStack_88,local_78[0]._M_allocated_capacity + 1);
          }
          if (local_a0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_a0._M_head_impl + 8))();
          }
          if (local_40[0] !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_40,local_40[0]);
          }
        }
        *(undefined1 *)(in_FS_OFFSET + -0x20) = 0;
        return;
      }
      testing::Message::Message((Message *)&local_48);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x197,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_48);
    }
    else {
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar1 + 1);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)auStack_88,"(leaf_count_after)",
                 "(node_counts_before[as_i<unodb::node_type::LEAF>] + 1)",(unsigned_long *)&local_98
                 ,(unsigned_long *)&local_48);
      if (auStack_88[0] != (internal)0x0) goto LAB_0012320c;
      testing::Message::Message((Message *)&local_48);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x19a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_48);
    }
    this_00 = &local_a0;
  }
  else {
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)auStack_88,"(mem_use_before)","(mem_use_after)",&local_b8,
               (unsigned_long *)&local_58);
    if (auStack_88[0] != (internal)0x0) goto LAB_00123142;
    testing::Message::Message((Message *)&local_48);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x192,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_48);
LAB_001233bf:
    this_00 = &local_98;
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_80;
LAB_0012345a:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,local_80);
  return;
}

Assistant:

void insert_internal(key_type k, unodb::value_view v,
                       bool bypass_verifier = false) {
    const auto empty_before = test_db.empty();
#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_before =
        parallel_test ? 0 : test_db.get_current_memory_use();
    const auto node_counts_before = test_db.get_node_counts();
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      do_insert(k, v);
    } catch (...) {
      if (!parallel_test) {
        UNODB_ASSERT_EQ(empty_before, test_db.empty());
#ifdef UNODB_DETAIL_WITH_STATS
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
#endif  // UNODB_DETAIL_WITH_STATS
      }
      throw;
    }

    UNODB_ASSERT_FALSE(test_db.empty());

#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_after = test_db.get_current_memory_use();
    if (parallel_test)
      UNODB_ASSERT_GT(mem_use_after, 0);
    else
      UNODB_ASSERT_LT(mem_use_before, mem_use_after);

    const auto leaf_count_after =
        test_db.template get_node_count<unodb::node_type::LEAF>();
    if (parallel_test)
      UNODB_ASSERT_GT(leaf_count_after, 0);
    else
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] + 1);
#endif  // UNODB_DETAIL_WITH_STATS

    if (!bypass_verifier) {
#ifndef NDEBUG
      allocation_failure_injector::reset();
#endif
      UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
      const auto [pos, insert_succeeded] = values.try_emplace(to_ikey(k), v);
      (void)pos;
      UNODB_ASSERT_TRUE(insert_succeeded);
    }
  }